

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::assign_impl
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,size_type count,
          double *value)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  size_t sVar4;
  
  pdVar2 = choose_data(this,count);
  this->m_end = pdVar2;
  this->m_begin = pdVar2;
  if (count != 0) {
    dVar1 = *value;
    pdVar3 = pdVar2;
    do {
      *pdVar3 = dVar1;
      pdVar3 = pdVar3 + 1;
      count = count - 1;
    } while (count != 0);
    this->m_end = pdVar3;
  }
  sVar4 = 4;
  if ((type *)pdVar2 != this->m_static_data) {
    sVar4 = this->m_dynamic_capacity;
  }
  this->m_capacity = sVar4;
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }